

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

QMatrix * Upper_Q(QMatrix *Q)

{
  LASErrIdType LVar1;
  QMatrix *Q_00;
  char *pcVar2;
  size_t sVar3;
  char *Object1Name;
  
  Q_Lock(Q);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    Q_00 = (QMatrix *)malloc(0xb0);
    pcVar2 = Q_GetName(Q);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 10);
    Object1Name = Q_GetName(Q);
    if (pcVar2 == (char *)0x0 || Q_00 == (QMatrix *)0x0) {
      LASError(LASMemAllocErr,"Upper_Q",Object1Name,(char *)0x0,(char *)0x0);
      if (Q_00 != (QMatrix *)0x0) {
        free(Q_00);
      }
    }
    else {
      sprintf(pcVar2,"Upper(%s)",Object1Name);
      Q_Constr(Q_00,pcVar2,Q->Dim,Q->Symmetry,Q->ElOrder,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        if ((Q->Instance == Tempor) && (Q->OwnData != False)) {
          Q->OwnData = False;
          Q_00->OwnData = True;
        }
        Q_00->MultiplD = 0.0;
        Q_00->MultiplU = Q->MultiplU;
        Q_00->MultiplL = 0.0;
        Q_00->Len = Q->Len;
        Q_00->El = Q->El;
        Q_00->ElSorted = Q->ElSorted;
        Q_00->DiagElAlloc = Q->DiagElAlloc;
        Q_00->DiagEl = Q->DiagEl;
        Q_00->ZeroInDiag = Q->ZeroInDiag;
        Q_00->InvDiagEl = Q->InvDiagEl;
        Q_00->UnitRightKer = Q->UnitRightKer;
        Q_00->RightKerCmp = Q->RightKerCmp;
        Q_00->UnitLeftKer = Q->UnitLeftKer;
        Q_00->LeftKerCmp = Q->LeftKerCmp;
        Q_00->ILUExists = Q->ILUExists;
        Q_00->ILU = Q->ILU;
      }
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  else {
    Q_00 = (QMatrix *)0x0;
  }
  Q_Unlock(Q);
  return Q_00;
}

Assistant:

QMatrix *Upper_Q(QMatrix *Q)
/* QRes = Upper(Q), returns the upper triagonal part of the matrix Q */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q);
    
    if (LASResult() == LASOK) {
        QRes = (QMatrix *)malloc(sizeof(QMatrix));
        QResName = (char *)malloc((strlen(Q_GetName(Q)) + 10) * sizeof(char));
        if (QRes != NULL && QResName != NULL) {
            sprintf(QResName, "Upper(%s)", Q_GetName(Q));
            Q_Constr(QRes, QResName, Q->Dim, Q->Symmetry, Q->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (Q->Instance == Tempor && Q->OwnData) {
                    Q->OwnData = False;
                    QRes->OwnData = True;
                }
                QRes->MultiplD = 0.0;
                QRes->MultiplU = Q->MultiplU;
                QRes->MultiplL = 0.0;
                QRes->Len = Q->Len;
                QRes->El = Q->El;
                QRes->ElSorted = Q->ElSorted;
                QRes->DiagElAlloc = Q->DiagElAlloc;
                QRes->DiagEl = Q->DiagEl;
                QRes->ZeroInDiag = Q->ZeroInDiag;
                QRes->InvDiagEl = Q->InvDiagEl;
                QRes->UnitRightKer = Q->UnitRightKer;
                QRes->RightKerCmp = Q->RightKerCmp;
                QRes->UnitLeftKer = Q->UnitLeftKer;
                QRes->LeftKerCmp = Q->LeftKerCmp;
                QRes->ILUExists = Q->ILUExists;
                QRes->ILU = Q->ILU;
            }
        } else {
            LASError(LASMemAllocErr, "Upper_Q", Q_GetName(Q), NULL, NULL);
            if (QRes != NULL)
                free(QRes);
        }
            
        if (QResName != NULL)
            free(QResName);
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q);

    return(QRes);
}